

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  size_t sVar1;
  xmlParserInputPtr pxVar2;
  commentSAXFunc p_Var3;
  size_t sVar4;
  uint val;
  uint uVar5;
  uint val_00;
  int iVar6;
  uint uVar7;
  xmlChar *val_01;
  char *msg;
  ulong uVar8;
  ulong uVar9;
  int l;
  int rl;
  int ql;
  int local_6c;
  size_t local_68;
  int local_5c;
  int local_58;
  uint local_54;
  ulong local_50;
  size_t local_48;
  int local_3c;
  ulong local_38;
  
  uVar8 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar8 = 10000000;
  }
  iVar6 = ctxt->input->id;
  local_68 = len;
  if (buf == (xmlChar *)0x0) {
    size = 100;
    buf = (xmlChar *)(*xmlMallocAtomic)(100);
    if (buf == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return;
    }
    local_68 = 0;
  }
  local_48 = size;
  local_3c = iVar6;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  val = xmlCurrentChar(ctxt,&local_58);
  if (val == 0) {
LAB_0015bea4:
    xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment not terminated\n",(xmlChar *)0x0);
  }
  else {
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
      goto LAB_0015baf1;
    }
    else if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800) {
LAB_0015baf1:
      pxVar2 = ctxt->input;
      if (*pxVar2->cur == '\n') {
        pxVar2->line = pxVar2->line + 1;
        pxVar2->col = 1;
      }
      else {
        pxVar2->col = pxVar2->col + 1;
      }
      pxVar2->cur = pxVar2->cur + local_58;
      uVar5 = xmlCurrentChar(ctxt,&local_5c);
      if (uVar5 == 0) goto LAB_0015bea4;
      if ((int)uVar5 < 0x100) {
        if ((0x1f < (int)uVar5) || ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
LAB_0015bb4f:
          pxVar2 = ctxt->input;
          if (*pxVar2->cur == '\n') {
            pxVar2->line = pxVar2->line + 1;
            pxVar2->col = 1;
          }
          else {
            pxVar2->col = pxVar2->col + 1;
          }
          pxVar2->cur = pxVar2->cur + local_5c;
          val_00 = xmlCurrentChar(ctxt,&local_6c);
          if (val_00 != 0) {
            local_50 = 0;
            val_01 = buf;
            local_38 = uVar8;
            do {
              sVar4 = local_48;
              buf = val_01;
              local_54 = uVar5;
              if ((int)val_00 < 0x100) {
                if ((0x1f < (int)val_00) ||
                   ((val_00 < 0xe && ((0x2600U >> (val_00 & 0x1f) & 1) != 0)))) goto LAB_0015bc71;
LAB_0015bed5:
                val_01[local_68] = '\0';
                if (val_00 == 0) {
                  msg = "Comment not terminated \n<!--%.50s\n";
                  goto LAB_0015bf73;
                }
                if ((int)val_00 < 0x100) {
                  if (((int)val_00 < 0x20) &&
                     ((0xd < val_00 || ((0x2600U >> (val_00 & 0x1f) & 1) == 0)))) {
LAB_0015bfbd:
                    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                      "xmlParseComment: invalid xmlChar value %d\n",val_00);
                    goto LAB_0015bec4;
                  }
                }
                else if ((0xfffff < val_00 - 0x10000 && 0x1ffd < val_00 - 0xe000) &&
                         0xd7ff < (int)val_00) goto LAB_0015bfbd;
                if (local_3c != ctxt->input->id) {
                  xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                                 "Comment doesn\'t start and stop in the same entity\n");
                }
                xmlNextChar(ctxt);
                if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                    (p_Var3 = ctxt->sax->comment, p_Var3 != (commentSAXFunc)0x0)) &&
                   (ctxt->disableSAX == 0)) {
                  (*p_Var3)(ctxt->userData,val_01);
                }
                goto LAB_0015bec4;
              }
              if ((0xfffff < val_00 - 0x10000 && 0x1ffd < val_00 - 0xe000) && 0xd7ff < (int)val_00)
              goto LAB_0015bed5;
LAB_0015bc71:
              if ((val_00 == 0x3e && (uVar5 ^ 0x2d) == 0) && (val ^ 0x2d) == 0) goto LAB_0015bed5;
              if ((uVar5 ^ 0x2d) == 0 && (val ^ 0x2d) == 0) {
                xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
              }
              sVar1 = local_48;
              if (sVar4 <= local_68 + 5) {
                sVar1 = sVar4 * 2;
                buf = (xmlChar *)(*xmlRealloc)(val_01,sVar1);
                uVar8 = local_38;
                if (buf == (xmlChar *)0x0) {
                  (*xmlFree)(val_01);
                  xmlErrMemory(ctxt,(char *)0x0);
                  return;
                }
              }
              local_48 = sVar1;
              sVar4 = local_68;
              if (local_58 == 1) {
                buf[local_68] = (xmlChar)val;
                local_68 = local_68 + 1;
              }
              else {
                iVar6 = xmlCopyCharMultiByte(buf + local_68,val);
                local_68 = sVar4 + (long)iVar6;
              }
              local_58 = local_5c;
              local_5c = local_6c;
              if (local_50 < 0x32) {
                uVar9 = local_50 + 1;
              }
              else {
                if (ctxt->progressive == 0) {
                  pxVar2 = ctxt->input;
                  if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
                     ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
                    xmlSHRINK(ctxt);
                  }
                }
                if ((ctxt->progressive == 0) &&
                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                  xmlGROW(ctxt);
                }
                if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015bec4;
                uVar9 = 0;
              }
              pxVar2 = ctxt->input;
              if (*pxVar2->cur == '\n') {
                pxVar2->line = pxVar2->line + 1;
                pxVar2->col = 1;
              }
              else {
                pxVar2->col = pxVar2->col + 1;
              }
              pxVar2->cur = pxVar2->cur + local_6c;
              uVar7 = xmlCurrentChar(ctxt,&local_6c);
              if (uVar7 == 0) {
                if (ctxt->progressive == 0) {
                  pxVar2 = ctxt->input;
                  if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
                     ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
                    xmlSHRINK(ctxt);
                  }
                }
                if ((ctxt->progressive == 0) &&
                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                  xmlGROW(ctxt);
                }
                uVar7 = xmlCurrentChar(ctxt,&local_6c);
              }
              val_01 = buf;
              val = local_54;
              uVar5 = val_00;
              val_00 = uVar7;
              local_50 = uVar9;
            } while (local_68 <= uVar8);
            msg = "Comment too big found";
            val_01 = (xmlChar *)0x0;
LAB_0015bf73:
            xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,msg,val_01);
            goto LAB_0015bec4;
          }
          goto LAB_0015bea4;
        }
      }
      else if ((uVar5 - 0x10000 < 0x100000 || uVar5 - 0xe000 < 0x1ffe) || (int)uVar5 < 0xd800)
      goto LAB_0015bb4f;
    }
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseComment: invalid xmlChar value %d\n",val);
  }
LAB_0015bec4:
  (*xmlFree)(buf);
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    size_t count = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int inputid;

    inputid = ctxt->input->id;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = (xmlChar *) xmlMallocAtomic(size);
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return;
	}
    }
    GROW;	/* Assure there's enough input data */
    q = CUR_CHAR(ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	return;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
	if (len + 5 >= size) {
	    xmlChar *new_buf;
            size_t new_size;

	    new_size = size * 2;
	    new_buf = (xmlChar *) xmlRealloc(buf, new_size);
	    if (new_buf == NULL) {
		xmlFree (buf);
		xmlErrMemory(ctxt, NULL);
		return;
	    }
	    buf = new_buf;
            size = new_size;
	}
	COPY_BUF(ql,buf,len,q);
	q = r;
	ql = rl;
	r = cur;
	rl = l;

	count++;
	if (count > 50) {
	    SHRINK;
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return;
            }
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    SHRINK;
	    GROW;
	    cur = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
	if (inputid != ctxt->input->id) {
	    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
		           "Comment doesn't start and stop in the same"
                           " entity\n");
	}
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    return;
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
    return;
}